

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

int __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::close(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
        *this,int __fd)

{
  bool bVar1;
  bool bVar2;
  int extraout_EAX;
  demand_t *d;
  bool was_full;
  lock_guard<std::mutex> lock;
  close_mode_t mode_local;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *this_local;
  
  lock._M_device._4_4_ = __fd;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->m_lock);
  if (this->m_status != closed) {
    this->m_status = closed;
    bVar1 = details::limited_preallocated_demand_queue::is_full(&this->m_queue);
    if (lock._M_device._4_4_ == 0) {
      while (bVar2 = details::limited_preallocated_demand_queue::is_empty(&this->m_queue),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        d = details::limited_preallocated_demand_queue::front(&this->m_queue);
        so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::trace_demand_drop_on_close
                  (&this->super_mchain_tracing_enabled_base,&this->super_abstract_message_chain_t,d)
        ;
        details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
      }
    }
    bVar2 = details::limited_preallocated_demand_queue::is_empty(&this->m_queue);
    if (bVar2) {
      notify_multi_chain_select_ops(this);
    }
    if (this->m_threads_to_wakeup != 0) {
      std::condition_variable::notify_all();
    }
    if (bVar1) {
      std::condition_variable::notify_all();
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return extraout_EAX;
}

Assistant:

virtual void
		close( close_mode_t mode ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				if( details::status::closed == m_status )
					return;

				m_status = details::status::closed;

				const bool was_full = m_queue.is_full();

				if( close_mode_t::drop_content == mode )
					{
						while( !m_queue.is_empty() )
							{
								this->trace_demand_drop_on_close(
										*this, m_queue.front() );
								m_queue.pop_front();
							}
					}

				// If queue is empty now and there is any multi chain select
				// than select_tail must be handled.
				if( m_queue.is_empty() )
					notify_multi_chain_select_ops();

				if( m_threads_to_wakeup )
					// Someone is waiting on empty chain for new messages.
					// It must be informed that no new messages will be here.
					m_underflow_cond.notify_all();

				if( was_full )
					// Someone can wait on full chain for free place for new message.
					// It must be informed that the chain is closed.
					m_overflow_cond.notify_all();
			}